

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

Array<kj::String> * __thiscall
kj::anon_unknown_59::InMemoryDirectory::listNames
          (Array<kj::String> *__return_storage_ptr__,InMemoryDirectory *this)

{
  size_t count;
  _Rb_tree_node_base *p_Var1;
  String *pSVar2;
  Array<kj::String> *result;
  StringPtr value;
  ArrayBuilder<kj::String> builder;
  Array<char> local_48;
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  
  MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::lockShared
            ((MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)&lock,&this->impl);
  count = ((lock.ptr)->entries)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  builder.ptr = kj::_::HeapArrayDisposer::allocateUninitialized<kj::String>(count);
  pSVar2 = builder.ptr + count;
  builder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  builder.pos = builder.ptr;
  builder.endPtr = pSVar2;
  for (p_Var1 = ((lock.ptr)->entries)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &((lock.ptr)->entries)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    value.content.size_ = (size_t)pSVar2;
    value.content.ptr = (char *)p_Var1[1]._M_parent;
    heapString((String *)&local_48,*(kj **)(p_Var1 + 1),value);
    ((builder.pos)->content).ptr = local_48.ptr;
    ((builder.pos)->content).size_ = local_48.size_;
    ((builder.pos)->content).disposer = local_48.disposer;
    local_48.ptr = (char *)0x0;
    local_48.size_ = 0;
    builder.pos = builder.pos + 1;
    pSVar2 = (String *)local_48.disposer;
    Array<char>::~Array(&local_48);
  }
  __return_storage_ptr__->ptr = builder.ptr;
  __return_storage_ptr__->size_ = ((long)builder.pos - (long)builder.ptr) / 0x18;
  __return_storage_ptr__->disposer = builder.disposer;
  builder.ptr = (String *)0x0;
  builder.pos = (RemoveConst<kj::String> *)0x0;
  builder.endPtr = (String *)0x0;
  ArrayBuilder<kj::String>::dispose(&builder);
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl>::~Locked(&lock);
  return __return_storage_ptr__;
}

Assistant:

Array<String> listNames() const override {
    auto lock = impl.lockShared();
    return KJ_MAP(e, lock->entries) { return heapString(e.first); };
  }